

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

size_type __thiscall
bk_lib::
pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
::grow_size(pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
            *this,size_type n)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = n + (this->ebo_).size;
  uVar1 = 2 << ((byte)uVar2 & 0x1f);
  if (3 < uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->ebo_).cap * 3 >> 1;
  if (uVar2 < uVar1) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

size_type grow_size(size_type n) {
		size_type new_cap = size() + n;
		assert(new_cap > size() && "pod_vector: max size exceeded!");
		assert(new_cap > capacity());
		if (new_cap < 4) new_cap = 1 << (new_cap+1);
		size_type x = (capacity()*3)>>1;
		if (new_cap < x) new_cap = x;
		return new_cap;
	}